

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtest.c
# Opt level: O1

char * get_fp(char *filename,uint flags)

{
  char *s;
  char *pcVar1;
  
  s = get_line(filename);
  if (s == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = cleanup_fp(s,flags);
    safefree(s);
  }
  return pcVar1;
}

Assistant:

char *get_fp(char *filename, unsigned flags)
{
    char *orig = get_line(filename);
    if (!orig)
        return NULL;
    char *toret = cleanup_fp(orig, flags);
    sfree(orig);
    return toret;
}